

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O3

bool __thiscall SGParser::Generator::Lex::MakeDFAUsingSyntaxTree(Lex *this,DFAGen *dfa)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pvVar2;
  pointer pvVar3;
  pointer pbVar4;
  bool bVar5;
  iterator iVar6;
  DFASyntaxTree<SGParser::Generator::RegExprDFANode> *tree;
  mapped_type *ppDVar7;
  long lVar8;
  pointer __k;
  undefined1 auStack_198 [8];
  DFAGen testdfa;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>_>
  macroSyntaxTrees;
  DFASyntaxTree<SGParser::Generator::RegExprDFANode> syntaxTree;
  String expr;
  String local_50;
  
  pvVar2 = (dfa->super_DFA).TransitionTable.
           super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (dfa->super_DFA).TransitionTable.
           super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar2 == pvVar3) {
    macroSyntaxTrees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&macroSyntaxTrees;
    macroSyntaxTrees._M_t._M_impl._0_4_ = 0;
    macroSyntaxTrees._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    macroSyntaxTrees._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    macroSyntaxTrees._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    __k = (this->MacroNames).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    pbVar4 = (this->MacroNames).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    macroSyntaxTrees._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         macroSyntaxTrees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if ((long)pbVar4 - (long)__k >> 5 !=
        (this->Macros)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
      __assert_fail("MacroNames.size() == Macros.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/Lex.cpp"
                    ,0x523,"bool SGParser::Generator::Lex::MakeDFAUsingSyntaxTree(DFAGen &)");
    }
    if (__k != pbVar4) {
      expr.field_2._8_8_ = &(this->Macros)._M_t._M_impl.super__Rb_tree_header;
      do {
        iVar6 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)this,__k);
        if (iVar6._M_node == (_Base_ptr)expr.field_2._8_8_) {
          __assert_fail("iter != Macros.end()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/Lex.cpp"
                        ,0x526,"bool SGParser::Generator::Lex::MakeDFAUsingSyntaxTree(DFAGen &)");
        }
        tree = (DFASyntaxTree<SGParser::Generator::RegExprDFANode> *)operator_new(0x28);
        tree->LexemeId = 0;
        tree->pRoot = (RegExprDFANode *)0x0;
        (tree->CharNodes).
        super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (tree->CharNodes).
        super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (tree->CharNodes).
        super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar5 = MakeSyntaxTree<SGParser::Generator::RegExprDFANode>
                          (this,tree,(String *)(iVar6._M_node + 2),
                           (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>_>
                            *)&testdfa.EmptyStateCount);
        if (bVar5) {
          ppDVar7 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>_>
                                  *)&testdfa.EmptyStateCount,__k);
          *ppDVar7 = tree;
        }
        else {
          DFASyntaxTree<SGParser::Generator::RegExprDFANode>::~DFASyntaxTree(tree);
          operator_delete(tree,0x28);
        }
        __k = __k + 1;
      } while (__k != pbVar4);
    }
    lVar8 = (long)(this->Lexemes).
                  super__Vector_base<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->Lexemes).
                  super__Vector_base<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if ((lVar8 != 0) &&
       ((this->Expressions).
        super__Vector_base<SGParser::Generator::Lex::Expression,_std::allocator<SGParser::Generator::Lex::Expression>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (this->Expressions).
        super__Vector_base<SGParser::Generator::Lex::Expression,_std::allocator<SGParser::Generator::Lex::Expression>_>
        ._M_impl.super__Vector_impl_data._M_start)) {
      auStack_198 = (undefined1  [8])((ulong)(uint)((int)(lVar8 >> 3) * -0x3b13b13b) << 0x20);
      std::
      vector<SGParser::Generator::Lex::Expression,_std::allocator<SGParser::Generator::Lex::Expression>_>
      ::emplace_back<SGParser::Generator::Lex::Expression>
                (&this->Expressions,(Expression *)auStack_198);
    }
    macroSyntaxTrees._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
    syntaxTree.LexemeId = 0;
    syntaxTree._4_4_ = 0;
    syntaxTree.pRoot = (RegExprDFANode *)0x0;
    syntaxTree.CharNodes.
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    syntaxTree.CharNodes.
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    syntaxTree.CharNodes.
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&expr._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &syntaxTree.CharNodes.
                super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,"(a|b)*(abb)+c","");
    MakeSyntaxTree<SGParser::Generator::RegExprDFANode>
              (this,(DFASyntaxTree<SGParser::Generator::RegExprDFANode> *)
                    &macroSyntaxTrees._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (String *)
               &syntaxTree.CharNodes.
                super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>_>
                *)&testdfa.EmptyStateCount);
    testdfa.super_DFA.CharTable._0_8_ =
         &testdfa.super_DFA.CharTable.values._M_h._M_rehash_policy._M_next_resize;
    testdfa.super_DFA.ExpressionStartStates.
    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    testdfa.super_DFA.ExpressionStartStates.
    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    testdfa.super_DFA.LexemeInfos.
    super__Vector_base<SGParser::LexemeInfo,_std::allocator<SGParser::LexemeInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    testdfa.super_DFA.LexemeInfos.
    super__Vector_base<SGParser::LexemeInfo,_std::allocator<SGParser::LexemeInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    testdfa.super_DFA.AcceptStates.
    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    testdfa.super_DFA.LexemeInfos.
    super__Vector_base<SGParser::LexemeInfo,_std::allocator<SGParser::LexemeInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    testdfa.super_DFA.AcceptStates.
    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    testdfa.super_DFA.AcceptStates.
    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    testdfa.super_DFA.TransitionTable.
    super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    testdfa.super_DFA.TransitionTable.
    super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    auStack_198._0_4_ = 0;
    auStack_198._4_4_ = 0;
    testdfa.super_DFA.TransitionTable.
    super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    testdfa.super_DFA.ExpressionStartStates.
    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0xffffffff;
    testdfa.super_DFA.CharTable.values._M_h._M_buckets = (__buckets_ptr)0x1;
    testdfa.super_DFA.CharTable.values._M_h._M_bucket_count = 0;
    testdfa.super_DFA.CharTable.values._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    testdfa.super_DFA.CharTable.values._M_h._M_element_count._0_4_ = 0x3f800000;
    testdfa.super_DFA.CharTable.values._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    testdfa.super_DFA.CharTable.values._M_h._M_rehash_policy._4_4_ = 0;
    testdfa.super_DFA.CharTable.values._M_h._M_rehash_policy._M_next_resize = 0;
    testdfa.super_DFA.CharTable.values._M_h._M_single_bucket._0_4_ = 0xff;
    testdfa.Messages.Flags = 0;
    testdfa.Messages._4_4_ = 0;
    testdfa.Messages.pMessages = (Messages *)0x0;
    paVar1 = &local_50.field_2;
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"aab","");
    DFAGen::TestString((DFAGen *)auStack_198,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"abbbababb","");
    DFAGen::TestString((DFAGen *)auStack_198,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"abb","");
    DFAGen::TestString((DFAGen *)auStack_198,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)&testdfa.super_DFA.CharTable);
    if (testdfa.super_DFA.LexemeInfos.
        super__Vector_base<SGParser::LexemeInfo,_std::allocator<SGParser::LexemeInfo>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      operator_delete(testdfa.super_DFA.LexemeInfos.
                      super__Vector_base<SGParser::LexemeInfo,_std::allocator<SGParser::LexemeInfo>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (long)testdfa.super_DFA.ExpressionStartStates.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)testdfa.super_DFA.LexemeInfos.
                            super__Vector_base<SGParser::LexemeInfo,_std::allocator<SGParser::LexemeInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    if (testdfa.super_DFA.AcceptStates.
        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      operator_delete(testdfa.super_DFA.AcceptStates.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                      (long)testdfa.super_DFA.LexemeInfos.
                            super__Vector_base<SGParser::LexemeInfo,_std::allocator<SGParser::LexemeInfo>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)testdfa.super_DFA.AcceptStates.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    if (testdfa.super_DFA.TransitionTable.
        super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      operator_delete(testdfa.super_DFA.TransitionTable.
                      super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (long)testdfa.super_DFA.AcceptStates.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)testdfa.super_DFA.TransitionTable.
                            super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::
    vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
    ::~vector((vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
               *)auStack_198);
    if (syntaxTree.CharNodes.
        super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&expr._M_string_length) {
      operator_delete(syntaxTree.CharNodes.
                      super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,expr._M_string_length + 1);
    }
    DFASyntaxTree<SGParser::Generator::RegExprDFANode>::~DFASyntaxTree
              ((DFASyntaxTree<SGParser::Generator::RegExprDFANode> *)
               &macroSyntaxTrees._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>_>
                 *)&testdfa.EmptyStateCount);
  }
  return pvVar2 == pvVar3;
}

Assistant:

bool Lex::MakeDFAUsingSyntaxTree(DFAGen& dfa) {
    if (dfa.IsValid())
        return false;

    // Go through all macros (in declaration-order) and create DFASyntaxTree's for them.
    // ("In declaration-order" so a lexically-later macro can refer to a lexically-earlier macro.)
    std::map<String, DFASyntaxTree<RegExprDFANode>*> macroSyntaxTrees;
    SG_ASSERT(MacroNames.size() == Macros.size());
    for (const String& name : MacroNames) {
        auto const iter = Macros.find(name);
        SG_ASSERT(iter != Macros.end());
        auto const& regExp = iter->second;

        // Create a new syntax tree
        const auto ptree = new DFASyntaxTree<RegExprDFANode>;

        // if the nfa failed to initialize then quite
        if (MakeSyntaxTree(*ptree, regExp, macroSyntaxTrees))
            macroSyntaxTrees[name] = ptree;
        else
            delete ptree; // Should we report an error?
    }

    // If there are lexemes, but not a single expression
    // make an expression for them (special case)
    if (Lexemes.size() && !Expressions.size())
        Expressions.push_back({0u, unsigned(Lexemes.size())});

    DFASyntaxTree<RegExprDFANode> syntaxTree;
    const String expr = "(a|b)*(abb)+c";

    MakeSyntaxTree(syntaxTree, expr, macroSyntaxTrees);

    const DFAGen testdfa;

    [[maybe_unused]] unsigned r;
    r = testdfa.TestString("aab");
    r = testdfa.TestString("abbbababb");
    r = testdfa.TestString("abb");

    return true;
}